

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

StructValues<wasm::(anonymous_namespace)::Bool> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::Bool>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::Bool> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  __buckets_ptr pp_Var4;
  __node_base_ptr p_Var5;
  HeapTypeKind HVar6;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
  *this_00;
  _Hash_node_base *p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  Struct *pSVar9;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  HeapType HVar12;
  ulong uVar13;
  size_type __n;
  _Hash_node_base *p_Var14;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
  *p_Var15;
  _Hash_node_base _Var16;
  __node_ptr __n_00;
  __node_base_ptr p_Var17;
  ulong uVar18;
  ulong uVar19;
  ulong __n_01;
  undefined1 auVar20 [16];
  _Hash_node_base local_48;
  HeapType type_local;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  
  local_48._M_nxt = (_Hash_node_base *)type.id;
  HVar6 = HeapType::getKind((HeapType *)&local_48);
  _Var16._M_nxt = local_48._M_nxt;
  if (HVar6 != Struct) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x3a,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::Bool>::operator[](HeapType) [T = wasm::(anonymous namespace)::Bool]"
                 );
  }
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
             *)operator_new(0x30);
  *(_Hash_node_base **)&this_00->field_0x0 = (_Hash_node_base *)0x0;
  *(_Hash_node_base **)&this_00[8].field_0x0 = _Var16._M_nxt;
  *(_Hash_node_base **)&this_00[0x10].field_0x0 = (_Hash_node_base *)0x0;
  *(_Hash_node_base **)&this_00[0x18].field_0x0 = (_Hash_node_base *)0x0;
  *(_Hash_node_base **)&this_00[0x20].field_0x0 = (_Hash_node_base *)0x0;
  p_Var7 = (_Hash_node_base *)
           std::hash<wasm::HeapType>::operator()
                     ((hash<wasm::HeapType> *)this,(HeapType *)(this_00 + 8));
  __n_00 = (__node_ptr)
           (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_bucket_count;
  p_Var17 = (__node_base_ptr)0x0;
  uVar13 = (ulong)p_Var7 % (ulong)__n_00;
  p_Var3 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_buckets[uVar13];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var10 = p_Var3->_M_nxt[5]._M_nxt;
    p_Var5 = p_Var3->_M_nxt;
    do {
      p_Var17 = p_Var3;
      if ((p_Var10 == p_Var7) && (*(_Hash_node_base **)&this_00[8].field_0x0 == p_Var5[1]._M_nxt))
      break;
      p_Var14 = p_Var5->_M_nxt;
      if (p_Var14 == (_Hash_node_base *)0x0) {
        p_Var17 = (__node_base_ptr)0x0;
        break;
      }
      p_Var10 = p_Var14[5]._M_nxt;
      p_Var17 = (__node_base_ptr)0x0;
      p_Var3 = p_Var5;
      p_Var5 = p_Var14;
    } while ((ulong)p_Var10 % (ulong)__n_00 == uVar13);
  }
  if (p_Var17 == (__node_base_ptr)0x0) {
    p_Var15 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
               *)0x0;
  }
  else {
    p_Var15 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
               *)p_Var17->_M_nxt;
  }
  HVar12.id = (uintptr_t)p_Var15;
  if (p_Var15 ==
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
       *)0x0) {
    type_local.id = (uintptr_t)p_Var15;
    auVar20 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->
                                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                                 )._M_h._M_rehash_policy,(ulong)__n_00,
                         (this->
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                         )._M_h._M_element_count);
    __n = auVar20._8_8_;
    if ((auVar20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_single_bucket;
        (this->
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (local_31,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      __n_00 = (__node_ptr)
               (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (__n_00 != (__node_ptr)0x0) {
        p_Var1 = &(this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                  )._M_h._M_before_begin;
        _Var16._M_nxt = (_Hash_node_base *)__n_00;
        uVar13 = 0;
        do {
          __n_00 = (__node_ptr)(_Var16._M_nxt)->_M_nxt;
          uVar18 = (ulong)_Var16._M_nxt[5]._M_nxt % __n;
          if (__s[uVar18] == (_Hash_node_base *)0x0) {
            (_Var16._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var16._M_nxt;
            __s[uVar18] = p_Var1;
            if ((_Var16._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var8 = __s + uVar13;
              goto LAB_00820563;
            }
          }
          else {
            (_Var16._M_nxt)->_M_nxt = __s[uVar18]->_M_nxt;
            pp_Var8 = &__s[uVar18]->_M_nxt;
            uVar18 = uVar13;
LAB_00820563:
            *pp_Var8 = _Var16._M_nxt;
          }
          _Var16._M_nxt = (_Hash_node_base *)__n_00;
          uVar13 = uVar18;
        } while (__n_00 != (__node_ptr)0x0);
      }
      pp_Var4 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                )._M_h._M_buckets;
      if (&(this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
           )._M_h._M_single_bucket != pp_Var4) {
        __n_00 = (__node_ptr)
                 ((this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                  )._M_h._M_bucket_count << 3);
        operator_delete(pp_Var4,(ulong)__n_00);
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_bucket_count = __n;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_buckets = __s;
      uVar13 = (ulong)p_Var7 % __n;
    }
    *(_Hash_node_base **)&this_00[0x28].field_0x0 = p_Var7;
    pp_Var4 = (this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
              )._M_h._M_buckets;
    if (pp_Var4[uVar13] == (__node_base_ptr)0x0) {
      __n_00 = (__node_ptr)
               &(this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                )._M_h._M_before_begin;
      p_Var7 = (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)&this_00->field_0x0 = p_Var7;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_00;
      if (p_Var7 != (_Hash_node_base *)0x0) {
        pp_Var4[(ulong)p_Var7[5]._M_nxt %
                (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
                )._M_h._M_bucket_count] = (__node_base_ptr)this_00;
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
      )._M_h._M_buckets[uVar13] = (__node_base_ptr)__n_00;
    }
    else {
      *(_Hash_node_base **)&this_00->field_0x0 = pp_Var4[uVar13]->_M_nxt;
      pp_Var4[uVar13]->_M_nxt = (_Hash_node_base *)this_00;
    }
    psVar2 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    p_Var15 = this_00;
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
               *)0x0;
    HVar12.id = type_local.id;
  }
  if (this_00 !=
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
       *)0x0) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
    ::_M_deallocate_node(this_00,__n_00);
  }
  if ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
       *)HVar12.id ==
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::Bool>_>,_true>_>_>
       *)0x0) {
    pSVar9 = HeapType::getStruct((HeapType *)&local_48);
    uVar13 = (long)(pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar9->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    p_Var7 = *(_Hash_node_base **)&p_Var15[0x18].field_0x0;
    uVar18 = (long)p_Var7 - (long)*(_Hash_node_base **)&p_Var15[0x10].field_0x0;
    __n_01 = uVar13 - uVar18;
    if (uVar13 < uVar18 || __n_01 == 0) {
      if ((uVar13 < uVar18) &&
         (p_Var10 = (_Hash_node_base *)
                    ((long)&(*(_Hash_node_base **)&p_Var15[0x10].field_0x0)->_M_nxt + uVar13),
         p_Var7 != p_Var10)) {
        *(_Hash_node_base **)&p_Var15[0x18].field_0x0 = p_Var10;
      }
    }
    else if ((ulong)((long)*(_Hash_node_base **)&p_Var15[0x20].field_0x0 - (long)p_Var7) < __n_01) {
      if ((uVar18 ^ 0x7fffffffffffffff) < __n_01) {
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar11 = __n_01;
      if (__n_01 < uVar18) {
        uVar11 = uVar18;
      }
      uVar19 = uVar11 + uVar18;
      if (0x7ffffffffffffffe < uVar19) {
        uVar19 = 0x7fffffffffffffff;
      }
      if (CARRY8(uVar11,uVar18)) {
        uVar19 = 0x7fffffffffffffff;
      }
      if (uVar19 == 0) {
        type_local.id = 0;
      }
      else {
        type_local.id = (uintptr_t)operator_new(uVar19);
      }
      memset((void *)(uVar18 + type_local.id),0,__n_01);
      p_Var10 = *(_Hash_node_base **)&p_Var15[0x18].field_0x0;
      p_Var7 = *(_Hash_node_base **)&p_Var15[0x10].field_0x0;
      HVar12.id = type_local.id;
      for (p_Var14 = p_Var7; p_Var14 != p_Var10;
          p_Var14 = (_Hash_node_base *)((long)&p_Var14->_M_nxt + 1)) {
        *(undefined1 *)HVar12.id = *(undefined1 *)&p_Var14->_M_nxt;
        HVar12.id = HVar12.id + 1;
      }
      if (p_Var7 != (_Hash_node_base *)0x0) {
        operator_delete(p_Var7,(long)*(_Hash_node_base **)&p_Var15[0x20].field_0x0 - (long)p_Var7);
      }
      *(uintptr_t *)&p_Var15[0x10].field_0x0 = type_local.id;
      *(_Hash_node_base **)&p_Var15[0x18].field_0x0 = (_Hash_node_base *)(uVar13 + type_local.id);
      *(_Hash_node_base **)&p_Var15[0x20].field_0x0 = (_Hash_node_base *)(uVar19 + type_local.id);
    }
    else {
      memset(p_Var7,0,__n_01);
      *(_Hash_node_base **)&p_Var15[0x18].field_0x0 = (_Hash_node_base *)((long)p_Var7 + __n_01);
    }
  }
  return (StructValues<wasm::(anonymous_namespace)::Bool> *)(p_Var15 + 0x10);
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }